

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

stbi__uint16 *
stbi__load_and_postprocess_16bit(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  stbi__uint16 *__ptr;
  stbi__uint16 *psVar1;
  undefined8 *puVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  int *piVar6;
  uint uVar7;
  stbi__result_info ri;
  stbi__result_info local_3c;
  
  __ptr = (stbi__uint16 *)stbi__load_main(s,x,y,comp,req_comp,&local_3c,0x10);
  if (__ptr == (stbi__uint16 *)0x0) {
    __ptr = (stbi__uint16 *)0x0;
  }
  else {
    if (local_3c.bits_per_channel != 0x10) {
      iVar4 = req_comp;
      if (req_comp == 0) {
        iVar4 = *comp;
      }
      uVar7 = *y * *x * iVar4;
      psVar1 = (stbi__uint16 *)malloc((long)(int)(uVar7 * 2));
      if (psVar1 == (stbi__uint16 *)0x0) {
        puVar2 = (undefined8 *)__tls_get_addr(&PTR_00160d40);
        *puVar2 = "outofmem";
        __ptr = psVar1;
      }
      else {
        if (0 < (int)uVar7) {
          uVar5 = 0;
          do {
            psVar1[uVar5] =
                 CONCAT11(*(undefined1 *)((long)__ptr + uVar5),*(undefined1 *)((long)__ptr + uVar5))
            ;
            uVar5 = uVar5 + 1;
          } while (uVar7 != uVar5);
        }
        free(__ptr);
        __ptr = psVar1;
      }
    }
    lVar3 = __tls_get_addr(&PTR_00160d40);
    piVar6 = &stbi__vertically_flip_on_load_global;
    if (*(int *)(lVar3 + 0xc) != 0) {
      piVar6 = (int *)(lVar3 + 8);
    }
    if (*piVar6 != 0) {
      if (req_comp == 0) {
        req_comp = *comp;
      }
      stbi__vertical_flip(__ptr,*x,*y,req_comp * 2);
    }
  }
  return __ptr;
}

Assistant:

static stbi__uint16 *stbi__load_and_postprocess_16bit(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   stbi__result_info ri;
   void *result = stbi__load_main(s, x, y, comp, req_comp, &ri, 16);

   if (result == NULL)
      return NULL;

   // it is the responsibility of the loaders to make sure we get either 8 or 16 bit.
   STBI_ASSERT(ri.bits_per_channel == 8 || ri.bits_per_channel == 16);

   if (ri.bits_per_channel != 16) {
      result = stbi__convert_8_to_16((stbi_uc *) result, *x, *y, req_comp == 0 ? *comp : req_comp);
      ri.bits_per_channel = 16;
   }

   // @TODO: move stbi__convert_format16 to here
   // @TODO: special case RGB-to-Y (and RGBA-to-YA) for 8-bit-to-16-bit case to keep more precision

   if (stbi__vertically_flip_on_load) {
      int channels = req_comp ? req_comp : *comp;
      stbi__vertical_flip(result, *x, *y, channels * sizeof(stbi__uint16));
   }

   return (stbi__uint16 *) result;
}